

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateExtensionRegistrationCode
          (ImmutableMessageGenerator *this,Printer *printer)

{
  Descriptor *pDVar1;
  long lVar2;
  long lVar3;
  ImmutableExtensionGenerator local_70;
  
  pDVar1 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar1 + 0x78)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      ImmutableExtensionGenerator::ImmutableExtensionGenerator
                (&local_70,(FieldDescriptor *)(*(long *)(pDVar1 + 0x80) + lVar2),this->context_);
      ImmutableExtensionGenerator::GenerateRegistrationCode(&local_70,printer);
      ImmutableExtensionGenerator::~ImmutableExtensionGenerator(&local_70);
      lVar3 = lVar3 + 1;
      pDVar1 = (this->super_MessageGenerator).descriptor_;
      lVar2 = lVar2 + 0xa8;
    } while (lVar3 < *(int *)(pDVar1 + 0x78));
  }
  pDVar1 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar1 + 0x48)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      ImmutableMessageGenerator
                ((ImmutableMessageGenerator *)&local_70,
                 (Descriptor *)(*(long *)(pDVar1 + 0x50) + lVar2),this->context_);
      GenerateExtensionRegistrationCode((ImmutableMessageGenerator *)&local_70,printer);
      local_70.super_ExtensionGenerator._vptr_ExtensionGenerator =
           (_func_int **)&PTR__ImmutableMessageGenerator_00427668;
      FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::
      ~FieldGeneratorMap((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>
                          *)&local_70.scope_);
      lVar3 = lVar3 + 1;
      pDVar1 = (this->super_MessageGenerator).descriptor_;
      lVar2 = lVar2 + 0xa8;
    } while (lVar3 < *(int *)(pDVar1 + 0x48));
  }
  return;
}

Assistant:

void ImmutableMessageGenerator::
GenerateExtensionRegistrationCode(io::Printer* printer) {
  for (int i = 0; i < descriptor_->extension_count(); i++) {
    ImmutableExtensionGenerator(descriptor_->extension(i), context_)
      .GenerateRegistrationCode(printer);
  }

  for (int i = 0; i < descriptor_->nested_type_count(); i++) {
    ImmutableMessageGenerator(descriptor_->nested_type(i), context_)
      .GenerateExtensionRegistrationCode(printer);
  }
}